

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O3

bool __thiscall
mjs::anon_unknown_33::has_own_property(anon_unknown_33 *this,object_ptr *o,wstring_view p)

{
  uint uVar1;
  long *plVar2;
  object_ptr *local_18;
  size_t local_10;
  
  local_10 = p._M_len;
  local_18 = o;
  plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
  uVar1 = (**(code **)(*plVar2 + 0x30))(plVar2,&local_18);
  if (uVar1 < 0x11) {
    return uVar1 != 0x10;
  }
  __assert_fail("static_cast<unsigned>(a) <= static_cast<unsigned>(property_attribute::invalid)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                ,0x24,"bool mjs::is_valid(property_attribute)");
}

Assistant:

bool has_own_property(const object_ptr& o, const std::wstring_view p) {
    return is_valid(o->own_property_attributes(p));
}